

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoQuad>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoQuad> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh,int64_t *index)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016b9de0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016b9a38,matind,mesh,index);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016b9738;
  pzgeom::TPZGeoQuad::TPZGeoQuad(&this->fGeo,nodeindices);
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xd8);
  for (lVar1 = 0; lVar1 != 0xd8; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}